

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateGetRootAsAccessors
          (KotlinKMPGenerator *this,string *struct_name,CodeWriter *writer,IDLOptions *options)

{
  IDLOptions *pIVar1;
  CodeWriter *pCVar2;
  anon_class_8_1_72ac95b1 local_150;
  function<void_()> local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  anon_class_8_1_72ac95b1 local_d8;
  function<void_()> local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  IDLOptions *local_28;
  IDLOptions *options_local;
  CodeWriter *writer_local;
  string *struct_name_local;
  KotlinKMPGenerator *this_local;
  
  local_28 = options;
  options_local = (IDLOptions *)writer;
  writer_local = (CodeWriter *)struct_name;
  struct_name_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"gr_name",&local_49);
  CodeWriter::SetValue(writer,&local_48,(string *)writer_local);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  GenerateJvmStaticAnnotation((CodeWriter *)options_local,(bool)(options->gen_jvmstatic & 1));
  pIVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"asRoot",&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"buffer: ReadWriteBuffer",&local_a9);
  pCVar2 = writer_local;
  local_d8.writer = (CodeWriter *)options_local;
  std::function<void()>::
  function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateGetRootAsAccessors(std::__cxx11::string_const&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
            ((function<void()> *)&local_d0,&local_d8);
  GenerateFunOneLine((CodeWriter *)pIVar1,&local_80,&local_a8,(string *)pCVar2,&local_d0,false);
  std::function<void_()>::~function(&local_d0);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  GenerateJvmStaticAnnotation((CodeWriter *)options_local,(bool)(options->gen_jvmstatic & 1));
  pIVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"asRoot",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"buffer: ReadWriteBuffer, obj: {{gr_name}}",&local_121);
  pCVar2 = writer_local;
  local_150.writer = (CodeWriter *)options_local;
  std::function<void()>::
  function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateGetRootAsAccessors(std::__cxx11::string_const&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_2_,void>
            ((function<void()> *)&local_148,&local_150);
  GenerateFunOneLine((CodeWriter *)pIVar1,&local_f8,&local_120,(string *)pCVar2,&local_148,false);
  std::function<void_()>::~function(&local_148);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  return;
}

Assistant:

void GenerateGetRootAsAccessors(const std::string &struct_name,
                                  CodeWriter &writer,
                                  IDLOptions options) const {
    // Generate a special accessor for the table that when used as the root
    // ex: fun getRootAsMonster(buffer: ByteBuffer): Monster {...}
    writer.SetValue("gr_name", struct_name);

    // create convenience method that doesn't require an existing object
    GenerateJvmStaticAnnotation(writer, options.gen_jvmstatic);
    GenerateFunOneLine(writer, "asRoot", "buffer: ReadWriteBuffer", struct_name,
                       [&]() { writer += "asRoot(buffer, {{gr_name}}())"; });

    // create method that allows object reuse
    // ex: fun Monster getRootAsMonster(buffer: ByteBuffer, obj: Monster) {...}
    GenerateJvmStaticAnnotation(writer, options.gen_jvmstatic);
    GenerateFunOneLine(
        writer, "asRoot", "buffer: ReadWriteBuffer, obj: {{gr_name}}",
        struct_name, [&]() {
          writer +=
              "obj.init(buffer.getInt(buffer.limit) + buffer.limit, buffer)";
        });
  }